

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Section::~Section(Section *this)

{
  char cVar1;
  IResultCapture *pIVar2;
  long lStack_b0;
  undefined1 local_a0 [8];
  SectionEndInfo endInfo;
  
  (this->super_NonCopyable)._vptr_NonCopyable = (_func_int **)&PTR__Section_00180c78;
  if (this->m_sectionIncluded == true) {
    endInfo.durationInSeconds = Timer::getElapsedSeconds(&this->m_timer);
    SectionInfo::SectionInfo((SectionInfo *)local_a0,&this->m_info);
    endInfo.prevAssertions.failed = (this->m_assertions).failedButOk;
    endInfo.sectionInfo.lineInfo.line = (this->m_assertions).passed;
    endInfo.prevAssertions.passed = (this->m_assertions).failed;
    endInfo.prevAssertions.failedButOk = (size_t)endInfo.durationInSeconds;
    cVar1 = std::uncaught_exception();
    if (cVar1 == '\0') {
      pIVar2 = getResultCapture();
      lStack_b0 = 0x20;
    }
    else {
      pIVar2 = getResultCapture();
      lStack_b0 = 0x28;
    }
    (**(code **)((long)pIVar2->_vptr_IResultCapture + lStack_b0))(pIVar2,local_a0);
    SectionInfo::~SectionInfo((SectionInfo *)local_a0);
  }
  std::__cxx11::string::~string((string *)&this->m_name);
  SectionInfo::~SectionInfo(&this->m_info);
  return;
}

Assistant:

Section::~Section() {
		if (m_sectionIncluded) {
			SectionEndInfo endInfo(m_info, m_assertions, m_timer.getElapsedSeconds());
			if (std::uncaught_exception())
				getResultCapture().sectionEndedEarly(endInfo);
			else
				getResultCapture().sectionEnded(endInfo);
		}
	}